

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O0

shared_ptr<MPL::ModelPackageItemInfo> __thiscall
MPL::detail::ModelPackageImpl::getRootModel(ModelPackageImpl *this)

{
  char *pcVar1;
  bool bVar2;
  pointer pJVar3;
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  shared_ptr<MPL::ModelPackageItemInfo> sVar4;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  string rootModelIdentifier;
  allocator<char> local_39;
  string local_38;
  ModelPackageImpl *this_local;
  
  this_local = this;
  pJVar3 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                     ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)
                      ((long)&in_RSI[3].field_2 + 8));
  pcVar1 = kModelPackageRootModelKey;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar1,&local_39);
  bVar2 = JsonMap::hasKey(pJVar3,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (!bVar2) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Failed to look up root model");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pJVar3 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                     ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)
                      ((long)&in_RSI[3].field_2 + 8));
  pcVar1 = kModelPackageRootModelKey;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pcVar1,&local_91);
  JsonMap::getString((string *)local_70,pJVar3,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  findItem(this,in_RSI);
  std::__cxx11::string::~string((string *)local_70);
  sVar4.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar4.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MPL::ModelPackageItemInfo>)
         sVar4.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ModelPackageItemInfo> ModelPackageImpl::getRootModel() const
{
    if (false == m_manifest->hasKey(kModelPackageRootModelKey)) {
        throw std::runtime_error("Failed to look up root model");
    }
    
    auto rootModelIdentifier = m_manifest->getString(kModelPackageRootModelKey);
    return findItem(rootModelIdentifier);
}